

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatTypeDSK.cpp
# Opt level: O3

int __thiscall
FormatTypeDSK::LoadDisk
          (FormatTypeDSK *this,uchar *buffer,size_t size,IDisk **created_disk,
          ILoadingProgress *loading_progress)

{
  Side *pSVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  uint uVar5;
  IDisk *this_00;
  void *pvVar6;
  Sector *pSVar7;
  void *pvVar8;
  MFMTrack *pMVar9;
  undefined8 *puVar10;
  uchar *__s;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  Track *pTVar16;
  uint uVar17;
  long lVar18;
  ulong uVar19;
  Track *pTVar20;
  uint local_a4;
  uint local_90;
  uint local_40;
  
  iVar14 = -1;
  if (*(long *)buffer == 0x435043202d20564d) {
    this_00 = (IDisk *)operator_new(0x68);
    IDisk::IDisk(this_00);
    bVar2 = buffer[0x30];
    bVar3 = buffer[0x31];
    local_a4 = 2;
    if (bVar3 < 2) {
      local_a4 = (uint)bVar3;
    }
    this_00->nb_sides_ = (uchar)local_a4;
    uVar4 = *(ushort *)(buffer + 0x32);
    uVar12 = (ulong)uVar4 - 0x100;
    if (bVar3 != 0) {
      uVar15 = (ulong)((uint)bVar2 * 8) * 5;
      uVar19 = 0;
      do {
        (&this->side_[0].nb_tracks)[uVar19] = bVar2;
        pvVar6 = operator_new__(uVar15);
        *(void **)((long)&this->side_[0].tracks + uVar19) = pvVar6;
        memset(pvVar6,0,uVar15);
        uVar19 = uVar19 + 0x10;
      } while (local_a4 << 4 != uVar19);
    }
    pvVar6 = operator_new__(uVar12);
    local_90 = (uint)bVar2;
    if (local_a4 != 0 && local_90 != 0) {
      uVar11 = 0;
      iVar14 = 0x100;
      do {
        bVar2 = buffer[(long)iVar14 + 0x11];
        memcpy(pvVar6,buffer + (long)iVar14 + 0x100,uVar12);
        bVar3 = this->side_[bVar2].nb_tracks;
        uVar13 = bVar3 - 1;
        if (buffer[(long)iVar14 + 0x10] < bVar3) {
          uVar13 = (uint)buffer[(long)iVar14 + 0x10];
        }
        bVar3 = buffer[(long)iVar14 + 0x14];
        pTVar20 = this->side_[bVar2].tracks;
        pTVar20[uVar13].sz = bVar3;
        pTVar20[uVar13].sector_size = 0x80 << (bVar3 & 0x1f);
        bVar3 = buffer[(long)iVar14 + 0x15];
        pTVar20[uVar13].nb_sector = (uint)bVar3;
        pTVar20[uVar13].gap3 = buffer[(long)iVar14 + 0x16];
        pTVar20[uVar13].gap3_filter = 'N';
        pSVar7 = (Sector *)operator_new__((ulong)bVar3 * 0x18);
        pTVar20[uVar13].sectors = pSVar7;
        uVar15 = (ulong)pTVar20[uVar13].nb_sector;
        if (uVar15 != 0) {
          pTVar16 = pTVar20 + uVar13;
          uVar5 = pTVar16->sector_size;
          uVar17 = 0x1d;
          lVar18 = 0;
          do {
            *(undefined4 *)(&pSVar7->track + lVar18) =
                 *(undefined4 *)(buffer + (ulong)(uVar17 - 5) + (long)iVar14);
            (&pSVar7->fdc_status_1)[lVar18] = buffer[(ulong)(uVar17 - 1) + (long)iVar14];
            (&pSVar7->fdc_status_2)[lVar18] = buffer[(ulong)uVar17 + (long)iVar14];
            *(short *)((long)&pSVar7->actual_size + lVar18) = (short)uVar5;
            lVar18 = lVar18 + 0x18;
            uVar17 = uVar17 + 8;
          } while (uVar15 * 0x18 != lVar18);
          if (uVar15 != 0) {
            uVar15 = 0;
            lVar18 = 0x10;
            uVar19 = 0;
            do {
              pvVar8 = operator_new__((ulong)pTVar16->sector_size);
              *(void **)(&(pTVar20[uVar13].sectors)->track + lVar18) = pvVar8;
              memcpy(*(void **)(&pTVar16->sectors->track + lVar18),(void *)(uVar19 + (long)pvVar6),
                     (ulong)pTVar16->sector_size);
              pTVar20 = this->side_[bVar2].tracks;
              pTVar16 = pTVar20 + uVar13;
              uVar19 = (ulong)((int)uVar19 + pTVar20[uVar13].sector_size);
              uVar15 = uVar15 + 1;
              lVar18 = lVar18 + 0x18;
            } while (uVar15 < pTVar20[uVar13].nb_sector);
            local_a4 = (uint)this_00->nb_sides_;
          }
        }
        local_40 = (uint)uVar4;
        iVar14 = iVar14 + local_40;
        uVar11 = uVar11 + 1;
      } while (uVar11 < local_a4 * local_90);
    }
    operator_delete__(pvVar6);
    if (this_00->nb_sides_ != '\0') {
      uVar12 = 0;
      do {
        bVar2 = this->side_[uVar12].nb_tracks;
        uVar15 = (ulong)bVar2 << 5;
        if (bVar2 < 0x2a) {
          uVar15 = 0x540;
        }
        pMVar9 = (MFMTrack *)operator_new__(uVar15);
        pSVar1 = this_00->side_ + uVar12;
        this_00->side_[uVar12].tracks = pMVar9;
        this_00->side_[uVar12].nb_tracks = (uint)bVar2;
        uVar15 = 0;
        if (bVar2 == 0) {
LAB_00144fbc:
          pMVar9 = pSVar1->tracks + uVar15;
          do {
            uVar15 = uVar15 + 1;
            pMVar9->nb_revolutions = 1;
            puVar10 = (undefined8 *)operator_new__(0x38);
            *puVar10 = 1;
            puVar10[3] = 0;
            puVar10[4] = 0;
            puVar10[5] = 0;
            pMVar9->revolution = (Revolution *)(puVar10 + 1);
            *(undefined4 *)(puVar10 + 2) = 0x40000;
            __s = (uchar *)operator_new__(0x40000);
            pMVar9->revolution->bitfield = __s;
            memset(__s,0,0x40000);
            pMVar9 = pMVar9 + 1;
          } while ((int)uVar15 != 0x2a);
        }
        else {
          lVar18 = 0;
          uVar19 = 0;
          do {
            pMVar9 = pSVar1->tracks;
            *(undefined4 *)((long)&pMVar9->nb_revolutions + lVar18) = 1;
            puVar10 = (undefined8 *)operator_new__(0x38);
            *puVar10 = 1;
            puVar10[3] = 0;
            puVar10[4] = 0;
            puVar10[5] = 0;
            *(undefined8 **)((long)&pMVar9->revolution + lVar18) = puVar10 + 1;
            uVar11 = FillTrack(this,(uchar *)0x0,(int)uVar12,(int)uVar19);
            pMVar9 = pSVar1->tracks;
            *(uint *)(*(long *)((long)&pMVar9->revolution + lVar18) + 8) = uVar11;
            if (uVar11 < 0x40000) {
              uVar15 = 0x40000;
            }
            else {
              uVar15 = (ulong)uVar11;
            }
            pvVar6 = operator_new__(uVar15);
            puVar10 = *(undefined8 **)((long)&pMVar9->revolution + lVar18);
            *puVar10 = pvVar6;
            memset(pvVar6,0,(ulong)*(uint *)(puVar10 + 1));
            FillTrack(this,(uchar *)**(undefined8 **)((long)&pMVar9->revolution + lVar18),
                      (int)uVar12,(int)uVar19);
            uVar19 = uVar19 + 1;
            uVar15 = (ulong)pSVar1->nb_tracks;
            lVar18 = lVar18 + 0x20;
          } while (uVar19 < uVar15);
          if (pSVar1->nb_tracks < 0x2a) goto LAB_00144fbc;
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 < this_00->nb_sides_);
    }
    (*this_00->_vptr_IDisk[0x14])(this_00);
    *created_disk = this_00;
    iVar14 = 0;
  }
  return iVar14;
}

Assistant:

int FormatTypeDSK::LoadDisk(const unsigned char* buffer, size_t size, IDisk*& created_disk,
                            ILoadingProgress* loading_progress)
{
   if (memcmp(buffer, "MV - CPC", 8) == 0)
   {
      IDisk* new_disk = new IDisk();

      // Name of creator : don't read
      // Number of tracks, and sides
      int nb_tracks = buffer[0x30];
      new_disk->nb_sides_ = buffer[0x31];

      if (new_disk->nb_sides_ > 2)
      {
         // ERROR ! Handle or correct ?
         new_disk->nb_sides_ = 2;
      }

      // Size of tracks
      int size_of_track = (buffer[0x32] + ((buffer[0x33]) << 8)) - 0x100;
      //m_NbSide = m_NbSide;

      // Format disk on memory
      int i, j;
      unsigned int k;
      for (i = 0; i < new_disk->nb_sides_; i++)
      {
         side_[i].nb_tracks = nb_tracks;
         side_[i].tracks = new Track[side_[i].nb_tracks];
         memset(side_[i].tracks, 0, sizeof(Track) * side_[i].nb_tracks);
      }


      // Read the tracks
      unsigned char* track_block = new unsigned char[size_of_track];

      int index_buffer = 0x100;
      for (j = 0; j < nb_tracks * new_disk->nb_sides_; j++)
      {
         const unsigned char* header = &buffer[index_buffer];
         index_buffer += 0x100;

         //fread(header, 0x100, 1, file);
         // Side number
         i = header[0x11];

         //fread(TrackBlock, m_SizeOfTrack, 1, file);
         memcpy(track_block, &buffer[index_buffer], size_of_track);
         index_buffer += size_of_track;
         // Track number
         unsigned int tn = header[0x10];
         if (tn >= side_[i].nb_tracks)
         {
            // bug...
            tn = side_[i].nb_tracks - 1;
         }
         unsigned char sector_size = side_[i].tracks[tn].sz = header[0x14];
         //SZ = sectorSize_L;
         side_[i].tracks[tn].sector_size = (0x80 << sector_size);
         // Number of sector
         side_[i].tracks[tn].nb_sector = header[0x15];
         side_[i].tracks[tn].gap3 = header[0x16];
         side_[i].tracks[tn].gap3_filter = 0x4E; // header [0x17];
         side_[i].tracks[tn].sectors = new Sector[side_[i].tracks[tn].nb_sector];
         // Sector info
         for (k = 0; k < side_[i].tracks[tn].nb_sector; k++)
         {
            side_[i].tracks[tn].sectors[k].track = header[0x18 + k * 8 + 00];
            side_[i].tracks[tn].sectors[k].side = header[0x18 + k * 8 + 01];
            side_[i].tracks[tn].sectors[k].sector_id = header[0x18 + k * 8 + 02];
            side_[i].tracks[tn].sectors[k].sector_size = header[0x18 + k * 8 + 03];
            side_[i].tracks[tn].sectors[k].fdc_status_1 = header[0x18 + k * 8 + 04];
            side_[i].tracks[tn].sectors[k].fdc_status_2 = header[0x18 + k * 8 + 05];

            side_[i].tracks[tn].sectors[k].actual_size = side_[i].tracks[tn].sector_size;
         }

         // Data
         unsigned int offset = 0;
         for (k = 0; k < side_[i].tracks[tn].nb_sector; k++)
         {
            side_[i].tracks[tn].sectors[k].data = new unsigned char[side_[i].tracks[tn].sector_size];
            memcpy(side_[i].tracks[tn].sectors[k].data, &track_block[offset], side_[i].tracks[tn].sector_size);
            offset += side_[i].tracks[tn].sector_size;
         }
      }
      delete[]track_block;

      // Fill the MFM structure
      for (int side = 0; side < new_disk->nb_sides_; side++)
      {
         new_disk->side_[side].tracks = new IDisk::MFMTrack[side_[side].nb_tracks < 42 ? 42 : side_[side].nb_tracks];
         new_disk->side_[side].nb_tracks = side_[side].nb_tracks;

         for (unsigned int track = 0; track < new_disk->side_[side].nb_tracks; track++)
         {
            // Init space
            new_disk->side_[side].tracks[track].nb_revolutions = 1; // Only one for DSK files
            new_disk->side_[side].tracks[track].revolution = new IDisk::Revolution[1];

            new_disk->side_[side].tracks[track].revolution[0].size = FillTrack(NULL, side, track);
            if (new_disk->side_[side].tracks[track].revolution[0].size < DEFAULT_TRACK_SIZE * 16)
            {
               new_disk->side_[side].tracks[track].revolution[0].bitfield = new unsigned char[DEFAULT_TRACK_SIZE * 16];
            }
            else
            {
               new_disk->side_[side].tracks[track].revolution[0].bitfield = new unsigned char[new_disk->side_[side].
                  tracks[track].revolution[0].size];
            }
            memset(new_disk->side_[side].tracks[track].revolution[0].bitfield, 0,
                   new_disk->side_[side].tracks[track].revolution[0].size);

            FillTrack(new_disk->side_[side].tracks[track].revolution[0].bitfield, side, track);
         }
         if (new_disk->side_[side].nb_tracks < 42)
         {
            for (unsigned int track = new_disk->side_[side].nb_tracks; track < 42; track++)
            {
               new_disk->side_[side].tracks[track].nb_revolutions = 1; // Only one for DSK files
               new_disk->side_[side].tracks[track].revolution = new IDisk::Revolution[1];

               new_disk->side_[side].tracks[track].revolution[0].size = DEFAULT_TRACK_SIZE * 16;
               new_disk->side_[side].tracks[track].revolution[0].bitfield = new unsigned char[new_disk->side_[side].
                  tracks[track].revolution[0].size];
               memset(new_disk->side_[side].tracks[track].revolution[0].bitfield, 0, DEFAULT_TRACK_SIZE * 16);
            }
         }
      }
      new_disk->CreateTrackFromMultiRevolutions();

      created_disk = new_disk;

      return OK;
   }
   return FILE_ERROR;
}